

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP5Serializer.cpp
# Opt level: O2

void __thiscall
adios2::format::BP5Serializer::BreakdownVarName
          (BP5Serializer *this,char *Name,char **base_name_p,int *type_p,int *element_size_p)

{
  char *pcVar1;
  int ElementSize;
  int Type;
  
  pcVar1 = strchr(Name,0x5f);
  pcVar1 = strchr(pcVar1 + 1,0x5f);
  __isoc99_sscanf(Name + 3,"%d_%d_",&ElementSize,&Type);
  *element_size_p = ElementSize;
  *type_p = Type;
  pcVar1 = strdup(pcVar1 + 1);
  *base_name_p = pcVar1;
  return;
}

Assistant:

void BP5Serializer::BreakdownVarName(const char *Name, char **base_name_p, int *type_p,
                                     int *element_size_p)
{
    int Type;
    int ElementSize;
    const char *NameStart = strchr(strchr(Name, '_') + 1, '_') + 1;
    sscanf(Name + 3, "%d_%d_", &ElementSize, &Type);
    *element_size_p = ElementSize;
    *type_p = Type;
    *base_name_p = strdup(NameStart);
}